

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

bool __thiscall ON_SubDVertex::RemoveFaceFromArray(ON_SubDVertex *this,ON_SubDFace *f)

{
  ushort uVar1;
  ON_SubDFace *pOVar2;
  unsigned_short vfi;
  ulong uVar3;
  ushort uVar4;
  ulong uVar5;
  
  if (f != (ON_SubDFace *)0x0) {
    uVar1 = this->m_face_count;
    if (((ulong)uVar1 != 0) && (this->m_faces != (ON_SubDFace **)0x0)) {
      uVar3 = 0;
      uVar4 = 0;
      do {
        pOVar2 = this->m_faces[uVar3];
        if (pOVar2 != f) {
          uVar5 = (ulong)uVar4;
          uVar4 = uVar4 + 1;
          this->m_faces[uVar5] = pOVar2;
        }
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
      if (uVar4 == uVar1) {
        return false;
      }
      this->m_face_count = uVar4;
      return true;
    }
  }
  ON_SubDIncrementErrorCount();
  return false;
}

Assistant:

bool ON_SubDVertex::RemoveFaceFromArray(const ON_SubDFace * f)
{
  if (nullptr == f || 0 == m_face_count || nullptr == m_faces)
    return ON_SUBD_RETURN_ERROR(false);
  unsigned short new_count = 0;
  for (unsigned short vfi = 0; vfi < m_face_count; ++vfi)
  {
    const ON_SubDFace* vf = m_faces[vfi];
    if (f == vf)
      continue;
    m_faces[new_count++] = vf;
  }
  if (new_count == m_face_count)
    return false;
  m_face_count = new_count;
  return true;
}